

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::CalcItemRectClosestPoint(ImVec2 *pos,bool on_edge,float outward)

{
  ImGuiWindow *pIVar1;
  undefined3 in_register_00000031;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar1 = GImGui->CurrentWindow;
  fVar8 = (pIVar1->DC).LastItemRect.Min.x - outward;
  fVar7 = (pIVar1->DC).LastItemRect.Min.y - outward;
  fVar9 = (pIVar1->DC).LastItemRect.Max.x + outward;
  fVar6 = outward + (pIVar1->DC).LastItemRect.Max.y;
  IVar3 = *pos;
  fVar2 = IVar3.x;
  if ((((CONCAT31(in_register_00000031,on_edge) != 0) || (fVar2 < fVar8)) || (IVar3.y < fVar7)) ||
     ((fVar9 <= fVar2 || (fVar6 <= IVar3.y)))) {
    if (fVar2 <= fVar9) {
      if (fVar2 < fVar8) {
        IVar3.x = fVar8;
      }
    }
    else {
      IVar3.x = fVar9;
    }
    IVar4.x = IVar3.x;
    if (fVar6 < IVar3.y) {
      IVar4.y = fVar6;
      return IVar4;
    }
    if (IVar3.y < fVar7) {
      IVar5.y = fVar7;
      IVar5.x = IVar4.x;
      return IVar5;
    }
  }
  return IVar3;
}

Assistant:

ImVec2 ImGui::CalcItemRectClosestPoint(const ImVec2& pos, bool on_edge, float outward)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImRect rect = window->DC.LastItemRect;
    rect.Expand(outward);
    return rect.GetClosestPoint(pos, on_edge);
}